

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-path.cpp
# Opt level: O2

void __thiscall gepard::Path::~Path(Path *this)

{
  PathData *this_00;
  
  this_00 = this->_pathData;
  if (this_00 != (PathData *)0x0) {
    Region<2040U>::~Region(&this_00->_region);
    operator_delete(this_00);
    return;
  }
  return;
}

Assistant:

Path::~Path()
{
    if (_pathData) {
        delete _pathData;
    }
}